

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
emplace_back<slang::ast::ConditionalExpression::Condition>
          (SmallVectorBase<slang::ast::ConditionalExpression::Condition> *this,Condition *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  Pattern *pPVar5;
  undefined8 uVar6;
  pointer pCVar7;
  pointer pCVar8;
  pointer pCVar9;
  long lVar10;
  long lVar11;
  pointer __src;
  ulong uVar12;
  long lVar13;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    pPVar5 = args->pattern;
    (__src->expr).ptr = (args->expr).ptr;
    __src->pattern = pPVar5;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar4 = this->cap;
  if (uVar12 < uVar4 * 2) {
    uVar12 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar12 = 0x7ffffffffffffff;
  }
  lVar13 = (long)__src - (long)this->data_;
  pCVar9 = (pointer)operator_new(uVar12 << 4);
  pPVar5 = args->pattern;
  *(undefined8 *)((long)pCVar9 + lVar13) = (args->expr).ptr;
  ((undefined8 *)((long)pCVar9 + lVar13))[1] = pPVar5;
  p = this->data_;
  lVar10 = this->len * 0x10;
  lVar11 = (long)p + (lVar10 - (long)__src);
  pCVar7 = p;
  pCVar8 = pCVar9;
  if (lVar11 == 0) {
    if (this->len != 0) {
      lVar11 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->expr).ptr + lVar11);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pCVar9->expr).ptr + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar11 = lVar11 + 0x10;
      } while (lVar10 != lVar11);
    }
  }
  else {
    for (; pCVar7 != __src; pCVar7 = pCVar7 + 1) {
      pPVar5 = pCVar7->pattern;
      (pCVar8->expr).ptr = (pCVar7->expr).ptr;
      pCVar8->pattern = pPVar5;
      pCVar8 = pCVar8 + 1;
    }
    memcpy((void *)((long)pCVar9 + lVar13 + 0x10),__src,(lVar11 - 0x10U & 0xfffffffffffffff0) + 0x10
          );
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar12;
  this->data_ = pCVar9;
  return (reference)((long)pCVar9 + lVar13);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }